

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O0

value_type __thiscall
jsoncons::jsonpath::detail::
to_number_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
evaluate(to_number_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
         *this,vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               *args,error_code *ec)

{
  json_type jVar1;
  bool bVar2;
  size_type sVar3;
  unsigned_long *puVar4;
  const_reference this_00;
  char *s_00;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar5;
  to_integer_errc tVar6;
  vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *in_RDX;
  undefined8 extraout_RDX;
  chars_to *this_01;
  undefined8 extraout_RDX_00;
  undefined8 uVar7;
  function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *in_RSI
  ;
  undefined8 in_RDI;
  optional<unsigned_long> oVar8;
  type tVar9;
  type tVar10;
  value_type vVar11;
  exception *anon_var_0;
  double d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  chars_to to_double;
  type result2;
  int64_t sn;
  type result1;
  uint64_t un;
  string_view_type sv;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> arg0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  jsonpath_errc __e;
  chars_to *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  size_t in_stack_fffffffffffffe98;
  basic_string_view<char,_std::char_traits<char>_> *this_02;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  size_t in_stack_fffffffffffffeb8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  string local_f0 [64];
  char *local_b0;
  to_integer_errc local_a8;
  char *local_a0;
  to_integer_errc local_98;
  undefined8 local_90;
  char *local_88;
  to_integer_errc local_80;
  char *local_78;
  to_integer_errc local_70;
  undefined8 local_68;
  string_view_type local_60;
  int local_50;
  _Storage<unsigned_long,_true> local_30;
  undefined1 local_28;
  vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *local_18;
  
  local_18 = in_RDX;
  sVar3 = std::
          vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          ::size(in_RDX);
  oVar8 = function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          ::arity(in_RSI);
  local_30._M_value =
       oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_28 = oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_engaged;
  puVar4 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x56ba08);
  if (sVar3 != *puVar4) {
    std::error_code::operator=
              ((error_code *)in_stack_fffffffffffffe70,
               (jsonpath_errc)((ulong)in_stack_fffffffffffffe68 >> 0x20));
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    uVar7 = extraout_RDX;
    goto LAB_0056be9b;
  }
  this_00 = std::
            vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            ::operator[](local_18,0);
  parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::value
            (this_00);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  jVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::type
                    (in_stack_fffffffffffffe68);
  __e = (jsonpath_errc)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  if (((byte)(jVar1 - int64_value) < 2) || (jVar1 == double_value)) {
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    local_50 = 1;
  }
  else if (jVar1 == string_value) {
    local_60 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                         (in_stack_fffffffffffffec0);
    this_01 = (chars_to *)local_60._M_str;
    local_68 = 0;
    this_02 = &local_60;
    std::basic_string_view<char,_std::char_traits<char>_>::data(this_02);
    std::basic_string_view<char,_std::char_traits<char>_>::length(this_02);
    tVar9 = jsoncons::detail::to_integer<unsigned_long,char>
                      ((char *)this_01,in_stack_fffffffffffffeb8,
                       (unsigned_long *)
                       CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
    s_00 = tVar9.ptr;
    tVar6 = tVar9.ec;
    local_88 = s_00;
    local_80 = tVar6;
    local_78 = s_00;
    local_70 = tVar6;
    bVar2 = jsoncons::detail::to_integer_result::operator_cast_to_bool
                      ((to_integer_result *)&local_78);
    if (bVar2) {
      jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
      basic_json<unsigned_long>(unsigned_long,jsoncons::semantic_tag,std::enable_if<ext_traits::
      is_unsigned_integer<unsigned_long>::value&&((sizeof(unsigned_long))<=(8ul)),int>::type_
                (in_stack_fffffffffffffe60,(unsigned_long)in_stack_fffffffffffffe58,none,0x56bbd1);
      local_50 = 1;
    }
    else {
      local_90 = 0;
      pbVar5 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               std::basic_string_view<char,_std::char_traits<char>_>::data(&local_60);
      std::basic_string_view<char,_std::char_traits<char>_>::length(&local_60);
      tVar10 = jsoncons::detail::to_integer<long,char>
                         ((char *)this_02,in_stack_fffffffffffffe98,
                          (long *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
      local_b0 = tVar10.ptr;
      local_a8 = tVar10.ec;
      local_a0 = local_b0;
      local_98 = local_a8;
      bVar2 = jsoncons::detail::to_integer_result::operator_cast_to_bool
                        ((to_integer_result *)&local_a0);
      if (bVar2) {
        jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
        basic_json<long>(long,jsoncons::semantic_tag,std::enable_if<ext_traits::
        is_signed_integer<long>::value&&((sizeof(long))<=(8ul)),int>::type_
                  (in_stack_fffffffffffffe60,(long)in_stack_fffffffffffffe58,none,0x56bc92);
        local_50 = 1;
      }
      else {
        jsoncons::detail::chars_to::chars_to(in_stack_fffffffffffffe70);
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
        as_string<std::allocator<char>>(pbVar5);
        __e = (jsonpath_errc)((ulong)local_f0 >> 0x20);
        in_stack_fffffffffffffe70 = (chars_to *)std::__cxx11::string::c_str();
        std::__cxx11::string::length();
        jsoncons::detail::chars_to::operator()
                  (this_01,s_00,CONCAT17(tVar6,in_stack_fffffffffffffeb0));
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
                  (in_stack_fffffffffffffe60,(double)in_stack_fffffffffffffe58,none);
        local_50 = 1;
        std::__cxx11::string::~string(local_f0);
        jsoncons::detail::chars_to::~chars_to((chars_to *)0x56be22);
        if (local_50 == 0) goto LAB_0056be31;
      }
    }
  }
  else {
LAB_0056be31:
    std::error_code::operator=((error_code *)in_stack_fffffffffffffe70,__e);
    pbVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
              (in_stack_fffffffffffffe60,pbVar5);
    local_50 = 1;
  }
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x56be8a);
  uVar7 = extraout_RDX_00;
LAB_0056be9b:
  vVar11.field_0.int64_.val_ = uVar7;
  vVar11.field_0._0_8_ = in_RDI;
  return (value_type)vVar11.field_0;
}

Assistant:

value_type evaluate(const std::vector<parameter_type>& args, 
            std::error_code& ec) const override
        {
            if (args.size() != *this->arity())
            {
                ec = jsonpath_errc::invalid_arity;
                return value_type::null();
            }

            auto arg0= args[0].value();
            switch (arg0.type())
            {
                case json_type::int64_value:
                case json_type::uint64_value:
                case json_type::double_value:
                    return arg0;
                case json_type::string_value:
                {
                    auto sv = arg0.as_string_view();
                    uint64_t un{0};
                    auto result1 = jsoncons::detail::to_integer(sv.data(), sv.length(), un);
                    if (result1)
                    {
                        return value_type(un, semantic_tag::none);
                    }
                    int64_t sn{0};
                    auto result2 = jsoncons::detail::to_integer(sv.data(), sv.length(), sn);
                    if (result2)
                    {
                        return value_type(sn, semantic_tag::none);
                    }
                    const jsoncons::detail::chars_to to_double;
                    try
                    {
                        auto s = arg0.as_string();
                        double d = to_double(s.c_str(), s.length());
                        return value_type(d, semantic_tag::none);
                    }
                    catch (const std::exception&)
                    {
                        return value_type::null();
                    }
                }
                default:
                    ec = jsonpath_errc::invalid_type;
                    return value_type::null();
            }
        }